

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O1

void av1_highbd_dist_wtd_convolve_y_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params,
               int bd)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  uint16_t *puVar4;
  int16_t *piVar5;
  char cVar6;
  char cVar7;
  byte bVar8;
  char cVar9;
  byte bVar10;
  uint uVar11;
  uint16_t *puVar12;
  ulong uVar13;
  ushort *puVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  ushort *puVar21;
  ushort *local_68;
  
  bVar8 = (byte)conv_params->round_1;
  cVar9 = (char)conv_params->round_0;
  cVar7 = bVar8 + cVar9;
  cVar6 = (char)bd - cVar7;
  if (0 < h) {
    puVar4 = conv_params->dst;
    uVar1 = filter_params_y->taps;
    iVar19 = (1 << (cVar6 + 0xdU & 0x1f)) + (1 << (cVar6 + 0xeU & 0x1f));
    bVar10 = 0xe - cVar7;
    piVar5 = filter_params_y->filter_ptr;
    iVar2 = conv_params->dst_stride;
    lVar16 = (long)src_stride;
    local_68 = src + (1 - (ulong)(uVar1 >> 1)) * lVar16;
    uVar15 = 0;
    do {
      if (0 < w) {
        iVar3 = conv_params->do_average;
        uVar13 = 0;
        puVar14 = local_68;
        do {
          if ((ulong)filter_params_y->taps == 0) {
            iVar20 = 0;
          }
          else {
            uVar18 = 0;
            iVar20 = 0;
            puVar21 = puVar14;
            do {
              iVar20 = iVar20 + (uint)*puVar21 *
                                (int)*(short *)((long)piVar5 +
                                               uVar18 * 2 +
                                               (ulong)((subpel_y_qn & 0xfU) * (uint)uVar1 * 2));
              uVar18 = uVar18 + 1;
              puVar21 = puVar21 + lVar16;
            } while (filter_params_y->taps != uVar18);
          }
          iVar20 = ((iVar20 << (7U - cVar9 & 0x1f)) + ((1 << (bVar8 & 0x1f)) >> 1) >> (bVar8 & 0x1f)
                   ) + iVar19;
          puVar12 = puVar4;
          iVar17 = iVar2;
          if (iVar3 != 0) {
            uVar11 = (uint)puVar4[uVar15 * (long)iVar2 + uVar13];
            if (conv_params->use_dist_wtd_comp_avg == 0) {
              iVar20 = (int)(iVar20 + uVar11) >> 1;
            }
            else {
              iVar20 = (int)(iVar20 * conv_params->bck_offset + uVar11 * conv_params->fwd_offset) >>
                       4;
            }
            iVar20 = iVar20 + (((1 << (bVar10 & 0x1f)) >> 1) - iVar19) >> (bVar10 & 0x1f);
            if (bd == 10) {
              iVar17 = 0x3ff;
            }
            else if (bd == 0xc) {
              iVar17 = 0xfff;
            }
            else {
              iVar17 = 0xff;
            }
            if (iVar17 <= iVar20) {
              iVar20 = iVar17;
            }
            puVar12 = dst;
            iVar17 = dst_stride;
            if (iVar20 < 1) {
              iVar20 = 0;
            }
          }
          puVar12[uVar13 + (long)iVar17 * uVar15] = (uint16_t)iVar20;
          uVar13 = uVar13 + 1;
          puVar14 = puVar14 + 1;
        } while (uVar13 != (uint)w);
      }
      uVar15 = uVar15 + 1;
      local_68 = local_68 + lVar16;
    } while (uVar15 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_y_c(const uint16_t *src, int src_stride,
                                      uint16_t *dst, int dst_stride, int w,
                                      int h,
                                      const InterpFilterParams *filter_params_y,
                                      const int subpel_y_qn,
                                      ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int bits = FILTER_BITS - conv_params->round_0;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  assert(round_bits >= 0);
  assert(bits >= 0);
  // vertical filter
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        res += y_filter[k] * src[(y - fo_vert + k) * src_stride + x];
      }
      res *= (1 << bits);
      res = ROUND_POWER_OF_TWO(res, conv_params->round_1) + round_offset;

      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, round_bits), bd);
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}